

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O3

void __thiscall leveldb::Histogram::Add(Histogram *this,double value)

{
  int b;
  ulong uVar1;
  double *pdVar2;
  
  pdVar2 = (double *)&kBucketLimit;
  uVar1 = 0;
  do {
    if (value < *pdVar2) goto LAB_00106fad;
    uVar1 = uVar1 + 1;
    pdVar2 = pdVar2 + 1;
  } while (uVar1 != 0x99);
  uVar1 = 0x99;
LAB_00106fad:
  this->buckets_[uVar1 & 0xffffffff] = this->buckets_[uVar1 & 0xffffffff] + 1.0;
  if (value < this->min_) {
    this->min_ = value;
  }
  if (this->max_ <= value && value != this->max_) {
    this->max_ = value;
  }
  this->num_ = this->num_ + 1.0;
  this->sum_ = value + this->sum_;
  this->sum_squares_ = value * value + this->sum_squares_;
  return;
}

Assistant:

void Histogram::Add(double value) {
  // Linear search is fast enough for our usage in db_bench
  int b = 0;
  while (b < kNumBuckets - 1 && kBucketLimit[b] <= value) {
    b++;
  }
  buckets_[b] += 1.0;
  if (min_ > value) min_ = value;
  if (max_ < value) max_ = value;
  num_++;
  sum_ += value;
  sum_squares_ += (value * value);
}